

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfile_property.c
# Opt level: O0

int mpt_logfile_set(mpt_logfile *log,char *name,mpt_convertable *src)

{
  int iVar1;
  char *pcStack_38;
  int lv;
  char *ign;
  uint8_t val;
  mpt_convertable *pmStack_28;
  int ret;
  mpt_convertable *src_local;
  char *name_local;
  mpt_logfile *log_local;
  
  pmStack_28 = src;
  src_local = (mpt_convertable *)name;
  name_local = (char *)log;
  if (name == (char *)0x0) {
    log_local._4_4_ = setHistfile(log,src);
  }
  else if (*name == '\0') {
    log_local._4_4_ = -1;
  }
  else {
    iVar1 = strcasecmp(name,"file");
    if (iVar1 == 0) {
      log_local._4_4_ = setHistfile((mpt_logfile *)name_local,pmStack_28);
    }
    else {
      iVar1 = strcasecmp((char *)src_local,"ignore");
      if (iVar1 == 0) {
        if (pmStack_28 == (mpt_convertable *)0x0) {
          name_local[10] = '\b';
          log_local._4_4_ = 0;
        }
        else {
          iVar1 = (*pmStack_28->_vptr->convert)(pmStack_28,0x79,(void *)((long)&ign + 3));
          if (-1 < iVar1) {
            name_local[10] = ign._3_1_;
          }
          log_local._4_4_ = -2;
        }
      }
      else {
        iVar1 = strcasecmp((char *)src_local,"level");
        if (iVar1 == 0) {
          pcStack_38 = (char *)0x0;
          if (pmStack_28 == (mpt_convertable *)0x0) {
            name_local[10] = '\b';
            log_local._4_4_ = 0;
          }
          else {
            ign._4_4_ = (*pmStack_28->_vptr->convert)(pmStack_28,0x73,&stack0xffffffffffffffc8);
            if (-1 < ign._4_4_) {
              iVar1 = mpt_log_level(pcStack_38);
              if (iVar1 < 0) {
                return iVar1;
              }
              name_local[10] = (char)iVar1 + '\x01';
            }
            log_local._4_4_ = ign._4_4_;
          }
        }
        else {
          log_local._4_4_ = -1;
        }
      }
    }
  }
  return log_local._4_4_;
}

Assistant:

extern int mpt_logfile_set(MPT_STRUCT(logfile) *log, const char *name, MPT_INTERFACE(convertable) *src)
{
	int ret;
	if (!name) {
		return setHistfile(log, src);
	}
	if (!*name) {
		return MPT_ERROR(BadArgument);
	}
	if (!strcasecmp(name, "file")) {
		return setHistfile(log, src);
	}
	if (!strcasecmp(name, "ignore")) {
		uint8_t val;
		if (!src) {
			log->ignore = MPT_LOG(Info);
			return 0;
		}
		if ((ret = src->_vptr->convert(src, 'y', &val)) >= 0) {
			log->ignore = val;
		}
		return MPT_ERROR(BadValue);
	}
	if (!strcasecmp(name, "level")) {
		const char *ign = 0;
		if (!src) {
			log->ignore = MPT_LOG(Info);
			return 0;
		}
		if ((ret = src->_vptr->convert(src, 's', &ign)) >= 0) {
			int lv = mpt_log_level(ign);
			if (lv < 0) {
				return lv;
			}
			log->ignore = lv + 1;
		}
		return ret;
	}
	return MPT_ERROR(BadArgument);
}